

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::BufferAccessHandler::handle
          (BufferAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t uVar1;
  uint32_t uVar2;
  SPIRConstant *pSVar3;
  iterator iVar4;
  SPIRType *type;
  bool bVar5;
  uint32_t index;
  uint32_t local_44;
  BufferRange local_40;
  
  bVar5 = true;
  if (0xfffffffc < opcode - OpArrayLength) {
    if (length < (opcode == OpPtrAccessChain | 4)) {
      bVar5 = false;
    }
    else if (args[2] == this->id) {
      pSVar3 = get<diligent_spirv_cross::SPIRConstant>
                         (this->compiler,args[(ulong)(opcode == OpPtrAccessChain) + 3]);
      local_44 = (pSVar3->m).c[0].r[0].u32;
      iVar4 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->seen)._M_h,&local_44);
      if (iVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        ::std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->seen,&local_44);
        type = expression_type(this->compiler,this->id);
        uVar1 = type_struct_member_offset(this->compiler,type,local_44);
        if ((ulong)(local_44 + 1) <
            (type->member_types).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
            buffer_size) {
          uVar2 = type_struct_member_offset(this->compiler,type,local_44 + 1);
          local_40.range = (size_t)(uVar2 - uVar1);
        }
        else {
          local_40.range = get_declared_struct_member_size(this->compiler,type,local_44);
        }
        local_40.index = local_44;
        local_40.offset = (size_t)uVar1;
        SmallVector<diligent_spirv_cross::BufferRange,_8UL>::push_back(this->ranges,&local_40);
      }
    }
  }
  return bVar5;
}

Assistant:

bool Compiler::BufferAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	if (opcode != OpAccessChain && opcode != OpInBoundsAccessChain && opcode != OpPtrAccessChain)
		return true;

	bool ptr_chain = (opcode == OpPtrAccessChain);

	// Invalid SPIR-V.
	if (length < (ptr_chain ? 5u : 4u))
		return false;

	if (args[2] != id)
		return true;

	// Don't bother traversing the entire access chain tree yet.
	// If we access a struct member, assume we access the entire member.
	uint32_t index = compiler.get<SPIRConstant>(args[ptr_chain ? 4 : 3]).scalar();

	// Seen this index already.
	if (seen.find(index) != end(seen))
		return true;
	seen.insert(index);

	auto &type = compiler.expression_type(id);
	uint32_t offset = compiler.type_struct_member_offset(type, index);

	size_t range;
	// If we have another member in the struct, deduce the range by looking at the next member.
	// This is okay since structs in SPIR-V can have padding, but Offset decoration must be
	// monotonically increasing.
	// Of course, this doesn't take into account if the SPIR-V for some reason decided to add
	// very large amounts of padding, but that's not really a big deal.
	if (index + 1 < type.member_types.size())
	{
		range = compiler.type_struct_member_offset(type, index + 1) - offset;
	}
	else
	{
		// No padding, so just deduce it from the size of the member directly.
		range = compiler.get_declared_struct_member_size(type, index);
	}

	ranges.push_back({ index, offset, range });
	return true;
}